

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O2

void __thiscall
COLLADABU::Math::Matrix3::fromEulerAnglesZYX
          (Matrix3 *this,Real *fYAngle_radian,Real *fPAngle_radian,Real *fRAngle_radian)

{
  double dVar1;
  long lVar2;
  Real *pRVar3;
  byte bVar4;
  Matrix3 local_190;
  Real local_148 [9];
  Matrix3 local_100;
  Matrix3 local_b8;
  Matrix3 local_70;
  
  bVar4 = 0;
  dVar1 = cos(*fYAngle_radian);
  local_70.m[1][0] = sin(*fYAngle_radian);
  local_70.m[0][1] = -local_70.m[1][0];
  local_70.m[0][2] = 0.0;
  local_70.m[2][1] = 0.0;
  local_70.m[1][2] = 0.0;
  local_70.m[2][0] = 0.0;
  local_70.m[2][2] = 1.0;
  local_70.m[0][0] = dVar1;
  local_70.m[1][1] = dVar1;
  dVar1 = cos(*fPAngle_radian);
  local_b8.m[0][2] = sin(*fPAngle_radian);
  local_b8.m[0][1] = 0.0;
  local_b8.m[1][0]._0_4_ = 0;
  local_b8.m[1][0]._4_4_ = 0;
  local_b8.m[1][1]._0_4_ = 0;
  local_b8.m[1][1]._4_4_ = 0x3ff00000;
  local_b8.m[1][2] = 0.0;
  local_b8.m[2][0] = -local_b8.m[0][2];
  local_b8.m[2][1] = 0.0;
  local_b8.m[0][0] = dVar1;
  local_b8.m[2][2] = dVar1;
  dVar1 = cos(*fRAngle_radian);
  local_100.m[2][1] = sin(*fRAngle_radian);
  local_100.m[0][0] = 1.0;
  local_100.m[0][1] = 0.0;
  local_100.m[0][2] = 0.0;
  local_100.m[1][0] = 0.0;
  local_100.m[1][2] = -local_100.m[2][1];
  local_100.m[2][0] = 0.0;
  local_100.m[1][1] = dVar1;
  local_100.m[2][2] = dVar1;
  operator*(&local_b8,&local_100);
  operator*(&local_70,&local_190);
  pRVar3 = local_148;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    this->m[0][0] = *pRVar3;
    pRVar3 = pRVar3 + (ulong)bVar4 * -2 + 1;
    this = (Matrix3 *)((long)this + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void Matrix3::fromEulerAnglesZYX ( const Real& fYAngle_radian, const Real& fPAngle_radian,
                                           const Real& fRAngle_radian )
        {
            Real fCos, fSin;

            fCos = cos( fYAngle_radian );
            fSin = sin( fYAngle_radian );
            Matrix3 kZMat( fCos, -fSin, 0.0, fSin, fCos, 0.0, 0.0, 0.0, 1.0 );

            fCos = cos( fPAngle_radian );
            fSin = sin( fPAngle_radian );
            Matrix3 kYMat( fCos, 0.0, fSin, 0.0, 1.0, 0.0, -fSin, 0.0, fCos );

            fCos = cos( fRAngle_radian );
            fSin = sin( fRAngle_radian );
            Matrix3 kXMat( 1.0, 0.0, 0.0, 0.0, fCos, -fSin, 0.0, fSin, fCos );

            *this = kZMat * ( kYMat * kXMat );
        }